

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_accumulator.cc
# Opt level: O0

void __thiscall justify::LineAccumulator::operator()(LineAccumulator *this,string *token)

{
  byte bVar1;
  uint8_t uVar2;
  size_t sVar3;
  reference pvVar4;
  int local_24;
  size_t local_20;
  size_t tokenLength;
  string *token_local;
  LineAccumulator *this_local;
  
  tokenLength = (size_t)token;
  token_local = (string *)this;
  sVar3 = anon_unknown.dwarf_1db42::getCharacterLength(token);
  local_20 = sVar3;
  bVar1 = getMissing(this);
  if (bVar1 < sVar3) {
    discharge(this,true);
  }
  local_24 = 0;
  std::
  vector<std::pair<std::__cxx11::string,unsigned_char>,std::allocator<std::pair<std::__cxx11::string,unsigned_char>>>
  ::emplace_back<std::__cxx11::string_const&,int>
            ((vector<std::pair<std::__cxx11::string,unsigned_char>,std::allocator<std::pair<std::__cxx11::string,unsigned_char>>>
              *)&this->tokens_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)tokenLength,
             &local_24);
  this->length_ = this->length_ + (char)local_20;
  uVar2 = getMissing(this);
  if (uVar2 != '\0') {
    pvVar4 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
             ::back(&this->tokens_);
    pvVar4->second = pvVar4->second + '\x01';
    this->length_ = this->length_ + '\x01';
  }
  return;
}

Assistant:

void LineAccumulator::operator()(const std::string& token) {
	const std::size_t tokenLength = getCharacterLength(token);

	if ( tokenLength > this->getMissing() ) {
		this->discharge(true);
	}

	this->tokens_.emplace_back(token, 0);
	this->length_ += tokenLength;

	if ( this->getMissing() > 0 ) {
		this->tokens_.back().second += 1;
		this->length_               += 1;
	}
}